

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ObjectsContext.cpp
# Opt level: O0

ObjectIDType __thiscall ObjectsContext::StartNewIndirectObject(ObjectsContext *this)

{
  bool bVar1;
  int iVar2;
  EStatusCode EVar3;
  undefined4 extraout_var;
  Trace *this_00;
  EStatusCode status;
  ObjectIDType newObjectID;
  ObjectsContext *this_local;
  
  this_local = (ObjectsContext *)
               IndirectObjectsReferenceRegistry::AllocateNewObjectID(&this->mReferencesRegistry);
  iVar2 = (*(this->mOutputStream->super_IByteWriter)._vptr_IByteWriter[3])();
  EVar3 = IndirectObjectsReferenceRegistry::MarkObjectAsWritten
                    (&this->mReferencesRegistry,(ObjectIDType)this_local,
                     CONCAT44(extraout_var,iVar2));
  if (EVar3 == eSuccess) {
    PrimitiveObjectsWriter::WriteInteger
              (&this->mPrimitiveWriter,(longlong)this_local,eTokenSeparatorSpace);
    PrimitiveObjectsWriter::WriteInteger(&this->mPrimitiveWriter,0,eTokenSeparatorSpace);
    PrimitiveObjectsWriter::WriteKeyword(&this->mPrimitiveWriter,&scObj_abi_cxx11_);
    bVar1 = IsEncrypting(this);
    if (bVar1) {
      EncryptionHelper::OnObjectStart(this->mEncryptionHelper,(longlong)this_local,0);
    }
  }
  else {
    this_00 = Trace::DefaultTrace();
    Trace::TraceToLog(this_00,
                      "ObjectsContext::StartNewIndirectObject, failed to mark object as written. Object ID = %ld"
                      ,this_local);
    this_local = (ObjectsContext *)0x0;
  }
  return (ObjectIDType)this_local;
}

Assistant:

ObjectIDType ObjectsContext::StartNewIndirectObject()
{
	ObjectIDType newObjectID = mReferencesRegistry.AllocateNewObjectID();
	EStatusCode status = mReferencesRegistry.MarkObjectAsWritten(newObjectID,mOutputStream->GetCurrentPosition());
	if(status != eSuccess)
	{
		TRACE_LOG1("ObjectsContext::StartNewIndirectObject, failed to mark object as written. Object ID = %ld",newObjectID);
		return 0;
	}
	mPrimitiveWriter.WriteInteger(newObjectID);
	mPrimitiveWriter.WriteInteger(0);
	mPrimitiveWriter.WriteKeyword(scObj);

	if(IsEncrypting()) {
		mEncryptionHelper->OnObjectStart((long long)newObjectID, 0);
	}

	return newObjectID;
}